

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O3

TRef lj_ir_kgc(jit_State *J,GCobj *o,IRType t)

{
  IRIns *pIVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  
  pIVar1 = (J->cur).ir;
  for (uVar2 = J->chain[0x18]; uVar2 != 0; uVar2 = *(ushort *)((long)pIVar1 + (ulong)uVar2 * 8 + 6))
  {
    uVar3 = (uint)uVar2;
    if (pIVar1[(ulong)uVar2 + 1] == (IRIns)o) goto LAB_001562e1;
  }
  uVar3 = (J->cur).nk - 2;
  uVar4 = (ulong)uVar3;
  if (uVar3 < J->irbotlim) {
    lj_ir_growbot(J);
    pIVar1 = (J->cur).ir;
  }
  (J->cur).nk = uVar3;
  pIVar1[uVar4].field_1.op12 = 0;
  pIVar1[uVar4 + 1] = (IRIns)o;
  *(char *)((long)pIVar1 + uVar4 * 8 + 4) = (char)t;
  *(undefined1 *)((long)pIVar1 + uVar4 * 8 + 5) = 0x18;
  *(IRRef1 *)((long)pIVar1 + uVar4 * 8 + 6) = J->chain[0x18];
  J->chain[0x18] = (IRRef1)uVar3;
LAB_001562e1:
  return t * 0x1000000 + uVar3;
}

Assistant:

TRef lj_ir_kgc(jit_State *J, GCobj *o, IRType t)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef ref;
  lj_assertJ(!isdead(J2G(J), o), "interning of dead GC object");
  for (ref = J->chain[IR_KGC]; ref; ref = cir[ref].prev)
    if (ir_kgc(&cir[ref]) == o)
      goto found;
  ref = ir_nextkgc(J);
  ir = IR(ref);
  /* NOBARRIER: Current trace is a GC root. */
  ir->op12 = 0;
  setgcref(ir[LJ_GC64].gcr, o);
  ir->t.irt = (uint8_t)t;
  ir->o = IR_KGC;
  ir->prev = J->chain[IR_KGC];
  J->chain[IR_KGC] = (IRRef1)ref;
found:
  return TREF(ref, t);
}